

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElGamalEncryption.cpp
# Opt level: O0

EllypticPoint * __thiscall
ElGamalEncryption::decode
          (EllypticPoint *__return_storage_ptr__,ElGamalEncryption *this,
          pair<EllypticPoint,_EllypticPoint> *C)

{
  EllypticPoint local_128;
  EllypticPoint local_a8;
  undefined1 local_21;
  pair<EllypticPoint,_EllypticPoint> *local_20;
  pair<EllypticPoint,_EllypticPoint> *C_local;
  ElGamalEncryption *this_local;
  EllypticPoint *P;
  
  local_21 = 0;
  local_20 = C;
  C_local = (pair<EllypticPoint,_EllypticPoint> *)this;
  this_local = (ElGamalEncryption *)__return_storage_ptr__;
  EllypticPoint::operator*(&local_128,&C->first,&this->d);
  EllypticPoint::operator-(&local_a8,&local_128);
  EllypticPoint::operator+(__return_storage_ptr__,&C->second,&local_a8);
  EllypticPoint::~EllypticPoint(&local_a8);
  EllypticPoint::~EllypticPoint(&local_128);
  return __return_storage_ptr__;
}

Assistant:

EllypticPoint ElGamalEncryption::decode(pair<EllypticPoint, EllypticPoint> C) {
    EllypticPoint P = C.second + (-(C.first * d));
    return P;
}